

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

HttpAuthDetails * parse_http_auth_header(HttpProxyNegotiator *s)

{
  strbuf *psVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  HttpAuthDetails *pHVar5;
  ptrlen pVar6;
  ulong local_60;
  size_t i;
  _Bool found;
  HttpAuthDetails *d;
  HttpProxyNegotiator *s_local;
  
  s_local = (HttpProxyNegotiator *)http_auth_details_new();
  *(HttpDigestHash *)&s_local->response = HTTP_DIGEST_MD5;
  _Var3 = get_token(s);
  if (_Var3) {
    iVar4 = strcasecmp(s->token->s,"Basic");
    if (iVar4 == 0) {
      s_local->crLine = AUTH_BASIC;
    }
    else {
      iVar4 = strcasecmp(s->token->s,"Digest");
      if (iVar4 == 0) {
        do {
          _Var3 = get_token(s);
          if (!_Var3) {
            pHVar5 = auth_error((HttpAuthDetails *)s_local,"parse error in Digest header");
            return pHVar5;
          }
          iVar4 = strcasecmp(s->token->s,"realm");
          if (iVar4 == 0) {
            _Var3 = get_separator(s,'=');
            if ((!_Var3) || (_Var3 = get_quoted_string(s), !_Var3)) {
              pHVar5 = auth_error((HttpAuthDetails *)s_local,"parse error in Digest realm field");
              return pHVar5;
            }
            psVar1 = s_local->header;
            pVar6 = ptrlen_from_strbuf(s->token);
            BinarySink_put_datapl(psVar1->binarysink_,pVar6);
          }
          else {
            iVar4 = strcasecmp(s->token->s,"nonce");
            if (iVar4 == 0) {
              _Var3 = get_separator(s,'=');
              if ((!_Var3) || (_Var3 = get_quoted_string(s), !_Var3)) {
                pHVar5 = auth_error((HttpAuthDetails *)s_local,"parse error in Digest nonce field");
                return pHVar5;
              }
              psVar1 = s_local->token;
              pVar6 = ptrlen_from_strbuf(s->token);
              BinarySink_put_datapl(psVar1->binarysink_,pVar6);
            }
            else {
              iVar4 = strcasecmp(s->token->s,"opaque");
              if (iVar4 == 0) {
                _Var3 = get_separator(s,'=');
                if ((!_Var3) || (_Var3 = get_quoted_string(s), !_Var3)) {
                  pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                      "parse error in Digest opaque field");
                  return pHVar5;
                }
                psVar1 = *(strbuf **)&s_local->http_status_pos;
                pVar6 = ptrlen_from_strbuf(s->token);
                BinarySink_put_datapl(psVar1->binarysink_,pVar6);
                *(_Bool *)&s_local->username = true;
              }
              else {
                iVar4 = strcasecmp(s->token->s,"stale");
                if (iVar4 == 0) {
                  _Var3 = get_separator(s,'=');
                  if ((!_Var3) || (_Var3 = get_token(s), !_Var3)) {
                    pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                        "parse error in Digest stale field");
                    return pHVar5;
                  }
                  iVar4 = strcasecmp(s->token->s,"true");
                  s_local->field_0x4 = (iVar4 != 0 ^ 0xffU) & 1;
                }
                else {
                  iVar4 = strcasecmp(s->token->s,"userhash");
                  if (iVar4 == 0) {
                    _Var3 = get_separator(s,'=');
                    if ((!_Var3) || (_Var3 = get_token(s), !_Var3)) {
                      pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                          "parse error in Digest userhash field");
                      return pHVar5;
                    }
                    iVar4 = strcasecmp(s->token->s,"true");
                    *(byte *)((long)&s_local->username + 1) = (iVar4 != 0 ^ 0xffU) & 1;
                  }
                  else {
                    iVar4 = strcasecmp(s->token->s,"algorithm");
                    if (iVar4 == 0) {
                      _Var3 = get_separator(s,'=');
                      if ((!_Var3) ||
                         ((_Var3 = get_token(s), !_Var3 && (_Var3 = get_quoted_string(s), !_Var3))))
                      {
                        pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                            "parse error in Digest algorithm field");
                        return pHVar5;
                      }
                      bVar2 = false;
                      for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
                        iVar4 = strcasecmp(s->token->s,httphashnames[local_60]);
                        if (iVar4 == 0) {
                          bVar2 = true;
                          break;
                        }
                      }
                      if (!bVar2) {
                        pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                            "Digest hash algorithm \'%s\' not recognised",
                                            s->token->s);
                        return pHVar5;
                      }
                      if ((httphashaccepted[local_60] & 1U) == 0) {
                        pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                            "Digest hash algorithm \'%s\' not supported",s->token->s
                                           );
                        return pHVar5;
                      }
                      *(HttpDigestHash *)&s_local->response = (HttpDigestHash)local_60;
                    }
                    else {
                      iVar4 = strcasecmp(s->token->s,"qop");
                      if (iVar4 == 0) {
                        _Var3 = get_separator(s,'=');
                        if ((!_Var3) || (_Var3 = get_quoted_string(s), !_Var3)) {
                          pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                              "parse error in Digest qop field");
                          return pHVar5;
                        }
                        iVar4 = strcasecmp(s->token->s,"auth");
                        if (iVar4 != 0) {
                          pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                              "quality-of-protection type \'%s\' not supported",
                                              s->token->s);
                          return pHVar5;
                        }
                      }
                      else {
                        _Var3 = get_separator(s,'=');
                        if ((!_Var3) ||
                           ((_Var3 = get_quoted_string(s), !_Var3 && (_Var3 = get_token(s), !_Var3))
                           )) {
                          pHVar5 = auth_error((HttpAuthDetails *)s_local,
                                              "parse error in Digest header");
                          return pHVar5;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          _Var3 = get_end_of_header(s);
          if (_Var3) {
            s_local->crLine = AUTH_DIGEST;
            return (HttpAuthDetails *)s_local;
          }
          _Var3 = get_separator(s,',');
        } while (_Var3);
        s_local = (HttpProxyNegotiator *)
                  auth_error((HttpAuthDetails *)s_local,"parse error in Digest header");
      }
      else {
        s_local = (HttpProxyNegotiator *)
                  auth_error((HttpAuthDetails *)s_local,"authentication type \'%s\' not supported",
                             s->token->s);
      }
    }
  }
  else {
    s_local = (HttpProxyNegotiator *)auth_error((HttpAuthDetails *)s_local,"parse error");
  }
  return (HttpAuthDetails *)s_local;
}

Assistant:

static HttpAuthDetails *parse_http_auth_header(HttpProxyNegotiator *s)
{
    HttpAuthDetails *d = http_auth_details_new();

    /* Default hash for HTTP Digest is MD5, if none specified explicitly */
    d->digest_hash = HTTP_DIGEST_MD5;

    if (!get_token(s))
        return auth_error(d, "parse error");

    if (!stricmp(s->token->s, "Basic")) {
        /* For Basic authentication, we don't need anything else. The
         * realm string is not required for the protocol. */
        d->auth_type = AUTH_BASIC;
        return d;
    }

    if (!stricmp(s->token->s, "Digest")) {
        /* Parse all the additional parts of the Digest header. */
        if (!http_digest_available)
            return auth_error(d, "Digest authentication not supported");

        /* Parse the rest of the Digest header */
        while (true) {
            if (!get_token(s))
                return auth_error(d, "parse error in Digest header");

            if (!stricmp(s->token->s, "realm")) {
                if (!get_separator(s, '=') ||
                    !get_quoted_string(s))
                    return auth_error(d, "parse error in Digest realm field");
                put_datapl(d->realm, ptrlen_from_strbuf(s->token));
            } else if (!stricmp(s->token->s, "nonce")) {
                if (!get_separator(s, '=') ||
                    !get_quoted_string(s))
                    return auth_error(d, "parse error in Digest nonce field");
                put_datapl(d->nonce, ptrlen_from_strbuf(s->token));
            } else if (!stricmp(s->token->s, "opaque")) {
                if (!get_separator(s, '=') ||
                    !get_quoted_string(s))
                    return auth_error(d, "parse error in Digest opaque field");
                put_datapl(d->opaque,
                           ptrlen_from_strbuf(s->token));
                d->got_opaque = true;
            } else if (!stricmp(s->token->s, "stale")) {
                if (!get_separator(s, '=') ||
                    !get_token(s))
                    return auth_error(d, "parse error in Digest stale field");
                d->digest_nonce_was_stale = !stricmp(
                    s->token->s, "true");
            } else if (!stricmp(s->token->s, "userhash")) {
                if (!get_separator(s, '=') ||
                    !get_token(s))
                    return auth_error(d, "parse error in Digest userhash "
                                      "field");
                d->hash_username = !stricmp(s->token->s, "true");
            } else if (!stricmp(s->token->s, "algorithm")) {
                if (!get_separator(s, '=') ||
                    (!get_token(s) && !get_quoted_string(s)))
                    return auth_error(d, "parse error in Digest algorithm "
                                      "field");
                bool found = false;
                size_t i;

                for (i = 0; i < N_HTTP_DIGEST_HASHES; i++) {
                    if (!stricmp(s->token->s, httphashnames[i])) {
                        found = true;
                        break;
                    }
                }

                if (!found) {
                    /* We don't even recognise the name */
                    return auth_error(d, "Digest hash algorithm '%s' not "
                                      "recognised", s->token->s);
                }

                if (!httphashaccepted[i]) {
                    /* We do recognise the name but we
                     * don't like it (see comment in cproxy.h) */
                    return auth_error(d, "Digest hash algorithm '%s' not "
                                      "supported", s->token->s);
                }

                d->digest_hash = i;
            } else if (!stricmp(s->token->s, "qop")) {
                if (!get_separator(s, '=') ||
                    !get_quoted_string(s))
                    return auth_error(d, "parse error in Digest qop field");
                if (stricmp(s->token->s, "auth"))
                    return auth_error(d, "quality-of-protection type '%s' not "
                                      "supported", s->token->s);
            } else {
                /* Ignore any other auth-param */
                if (!get_separator(s, '=') ||
                    (!get_quoted_string(s) && !get_token(s)))
                    return auth_error(d, "parse error in Digest header");
            }

            if (get_end_of_header(s))
                break;
            if (!get_separator(s, ','))
                return auth_error(d, "parse error in Digest header");
        }
        d->auth_type = AUTH_DIGEST;
        return d;
    }

    return auth_error(d, "authentication type '%s' not supported",
                      s->token->s);
}